

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O0

void __thiscall Ptex::v2_4::PtexReader::MetaData::getValue(MetaData *this,char *key,char **value)

{
  ulong uVar1;
  Entry *pEVar2;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  Entry *e;
  MetaDataType type;
  int index;
  undefined1 local_20 [4];
  undefined4 local_1c;
  undefined8 *local_18;
  
  local_1c = 0xffffffff;
  local_18 = in_RDX;
  uVar1 = (**(code **)(*in_RDI + 0x28))(in_RDI,in_RSI,&local_1c,local_20);
  if ((uVar1 & 1) == 0) {
    *local_18 = 0;
  }
  else {
    pEVar2 = getEntry(_type,e._4_4_);
    if ((pEVar2 == (Entry *)0x0) || (pEVar2->type != mdt_string)) {
      *local_18 = 0;
    }
    else {
      *local_18 = pEVar2->data;
    }
  }
  return;
}

Assistant:

virtual void getValue(const char* key, const char*& value)
	{
	    int index = -1;
	    MetaDataType type;
	    if (!findKey(key, index, type)) {
                value = 0;
                return;
            }
            Entry* e = getEntry(index);
	    if (e && e->type == mdt_string) value = (const char*) e->data;
	    else value = 0;
	}